

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall Jupiter::File::load(File *this,char *file)

{
  bool bVar1;
  FILE *__stream;
  bool result;
  FILE *filePtr;
  char *file_local;
  File *this_local;
  
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->m_data->fileName);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&this->m_data->fileName,file);
    }
    this_local._7_1_ = load(this,(FILE *)__stream);
    fclose(__stream);
  }
  return this_local._7_1_;
}

Assistant:

bool Jupiter::File::load(const char *file) {
	FILE *filePtr = fopen(file, "rb");
	if (filePtr == nullptr) {
		return false;
	}

	if (m_data->fileName.empty()) {
		m_data->fileName = file;
	}

	bool result = load(filePtr);
	fclose(filePtr);
	return result;
}